

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::CheckFON1Chars(FSingleLumpFont *this,double *luminosity)

{
  void *pvVar1;
  FFontChar2 *this_00;
  byte *pbVar2;
  byte local_24d;
  int local_24c;
  int iStack_248;
  SBYTE code;
  int destSize;
  int j;
  int i;
  BYTE *data_p;
  BYTE reverse [256];
  BYTE used [256];
  int local_28;
  BYTE *data;
  FMemLump memLump;
  double *luminosity_local;
  FSingleLumpFont *this_local;
  
  memLump.Block.Chars = (FString)(FString)luminosity;
  FWadCollection::ReadLump((FWadCollection *)&data,0x1f756a0);
  pvVar1 = FMemLump::GetMem((FMemLump *)&data);
  memset(reverse + 0xf8,0,0x100);
  _j = (byte *)((long)pvVar1 + 8);
  for (destSize = 0; destSize < 0x100; destSize = destSize + 1) {
    local_24c = (this->super_FFont).SpaceWidth * (this->super_FFont).FontHeight;
    if ((this->super_FFont).Chars[destSize].Pic == (FTexture *)0x0) {
      this_00 = (FFontChar2 *)operator_new(0x78);
      local_28 = (int)pvVar1;
      FFontChar2::FFontChar2
                (this_00,(this->super_FFont).Lump,j - local_28,(this->super_FFont).SpaceWidth,
                 (this->super_FFont).FontHeight,0,0);
      (this->super_FFont).Chars[destSize].Pic = (FTexture *)this_00;
      (this->super_FFont).Chars[destSize].XMove = (this->super_FFont).SpaceWidth;
    }
    do {
      pbVar2 = _j + 1;
      local_24d = *_j;
      if ((char)local_24d < '\0') {
        if (local_24d != 0x80) {
          reverse[(ulong)*pbVar2 + 0xf8] = '\x01';
          local_24c = local_24c - (1 - (char)local_24d);
          pbVar2 = _j + 2;
        }
      }
      else {
        local_24c = local_24c - ((char)local_24d + 1);
        _j = pbVar2;
        while (pbVar2 = _j, -1 < (char)local_24d) {
          reverse[(ulong)*_j + 0xf8] = '\x01';
          local_24d = local_24d - 1;
          _j = _j + 1;
        }
      }
      _j = pbVar2;
    } while (0 < local_24c);
  }
  memset((this->super_FFont).PatchRemap,0,0x100);
  data_p._0_1_ = 0;
  iStack_248 = 1;
  for (destSize = 1; destSize < 0x100; destSize = destSize + 1) {
    if (reverse[(long)destSize + 0xf8] != '\0') {
      reverse[(long)iStack_248 + -8] = (BYTE)destSize;
      iStack_248 = iStack_248 + 1;
    }
  }
  for (destSize = 1; destSize < iStack_248; destSize = destSize + 1) {
    (this->super_FFont).PatchRemap[reverse[(long)destSize + -8]] = (BYTE)destSize;
    *(double *)((long)memLump.Block.Chars + (long)destSize * 8) =
         (double)(int)(reverse[(long)destSize + -8] - 1) / 254.0;
  }
  (this->super_FFont).ActiveColors = iStack_248;
  FMemLump::~FMemLump((FMemLump *)&data);
  return;
}

Assistant:

void FSingleLumpFont::CheckFON1Chars (double *luminosity)
{
	FMemLump memLump = Wads.ReadLump(Lump);
	const BYTE* data = (const BYTE*) memLump.GetMem();

	BYTE used[256], reverse[256];
	const BYTE *data_p;
	int i, j;

	memset (used, 0, 256);
	data_p = data + 8;

	for (i = 0; i < 256; ++i)
	{
		int destSize = SpaceWidth * FontHeight;

		if(!Chars[i].Pic)
		{
			Chars[i].Pic = new FFontChar2 (Lump, int(data_p - data), SpaceWidth, FontHeight);
			Chars[i].XMove = SpaceWidth;
		}

		// Advance to next char's data and count the used colors.
		do
		{
			SBYTE code = *data_p++;
			if (code >= 0)
			{
				destSize -= code+1;
				while (code-- >= 0)
				{
					used[*data_p++] = 1;
				}
			}
			else if (code != -128)
			{
				used[*data_p++] = 1;
				destSize -= 1 - code;
			}
		} while (destSize > 0);
	}

	memset (PatchRemap, 0, 256);
	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; ++i)
	{
		if (used[i])
		{
			reverse[j++] = i;
		}
	}
	for (i = 1; i < j; ++i)
	{
		PatchRemap[reverse[i]] = i;
		luminosity[i] = (reverse[i] - 1) / 254.0;
	}
	ActiveColors = j;
}